

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# values.h
# Opt level: O0

int * __thiscall mpt::value_store::set<int>(value_store *this,span<const_int> *data,long pos)

{
  type_traits *ptVar1;
  long lVar2;
  iterator piVar3;
  int local_54;
  int type;
  void *ptr;
  long pos_local;
  span<const_int> *data_local;
  value_store *this_local;
  
  if ((set<int>::traits == (type_traits *)0x0) &&
     (set<int>::traits = type_properties<int>::traits(), set<int>::traits == (type_traits *)0x0)) {
    this_local = (value_store *)0x0;
  }
  else {
    ptVar1 = set<int>::traits;
    lVar2 = span<const_int>::size(data);
    piVar3 = span<const_int>::begin(data);
    this_local = (value_store *)
                 mpt::value_store::set
                           ((type_traits *)this,(ulong)ptVar1,(void *)(lVar2 << 2),(long)piVar3);
    if (this_local != (value_store *)0x0) {
      local_54 = type_properties<int>::id(false);
      if (local_54 < 1) {
        local_54 = 0;
      }
      this->_type = (uint16_t)local_54;
    }
  }
  return (int *)this_local;
}

Assistant:

T *set(const span<const T> &data, long pos = 0)
	{
		static const struct type_traits *traits = 0;
		if (!traits && !(traits = type_properties<T>::traits())) {
			return 0;
		}
		void *ptr = set(*traits, data.size() * sizeof(T), data.begin(), pos);
		if (ptr) {
			/* type ID registration may take place during runtime */
			int type = type_properties<T>::id(false);
			_type = (type > 0) ? type : 0;
		}
		return static_cast<T *>(ptr);
	}